

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_NewCFunctionData(JSContext *ctx,JSCFunctionData *func,int length,int magic,int data_len,
                           JSValue *data)

{
  JSValue func_obj_00;
  JSValue JVar1;
  int iVar2;
  undefined8 *opaque;
  undefined2 in_CX;
  undefined1 in_DL;
  undefined8 in_RSI;
  JSContext *in_RDI;
  int in_R8D;
  long in_R9;
  JSValue JVar3;
  int i;
  JSValue func_obj;
  JSCFunctionDataRecord *s;
  JSContext *in_stack_ffffffffffffff80;
  JSValueUnion *pJVar4;
  JSValue in_stack_ffffffffffffff88;
  JSValueUnion ctx_00;
  JSValueUnion ctx_01;
  JSValue in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa8;
  JSAtom name;
  int32_t local_10;
  undefined4 uStack_c;
  JSValueUnion local_8;
  
  JVar3 = JS_NewObjectProtoClass
                    ((JSContext *)in_stack_ffffffffffffff88.tag,in_stack_ffffffffffffff98,
                     in_stack_ffffffffffffff88.u._4_4_);
  ctx_00 = JVar3.u;
  local_8 = (JSValueUnion)JVar3.tag;
  ctx_01 = ctx_00;
  iVar2 = JS_IsException(JVar3);
  if (iVar2 == 0) {
    opaque = (undefined8 *)js_malloc((JSContext *)ctx_01.ptr,in_stack_ffffffffffffff88.tag);
    if (opaque == (undefined8 *)0x0) {
      JS_FreeValue(in_stack_ffffffffffffff80,in_stack_ffffffffffffff88);
      local_10 = 0;
      local_8.float64 = 2.96439387504748e-323;
    }
    else {
      *opaque = in_RSI;
      *(undefined1 *)(opaque + 1) = in_DL;
      *(char *)((long)opaque + 9) = (char)in_R8D;
      *(undefined2 *)((long)opaque + 10) = in_CX;
      for (name = 0; (int)name < in_R8D; name = name + 1) {
        pJVar4 = (JSValueUnion *)(opaque + (long)(int)name * 2 + 2);
        JVar3 = JS_DupValue(in_RDI,*(JSValue *)(in_R9 + (long)(int)name * 0x10));
        *pJVar4 = JVar3.u;
        pJVar4[1] = (JSValueUnion)JVar3.tag;
      }
      JVar3.tag = (int64_t)local_8.ptr;
      JVar3.u.float64 = ctx_00.float64;
      JS_SetOpaque(JVar3,opaque);
      func_obj_00.tag = (int64_t)opaque;
      func_obj_00.u.ptr = local_8.ptr;
      js_function_set_properties((JSContext *)ctx_00.ptr,func_obj_00,name,in_stack_ffffffffffffffa8)
      ;
      local_10 = ctx_00.int32;
      uStack_c = ctx_00._4_4_;
    }
  }
  else {
    local_10 = ctx_00.int32;
    uStack_c = ctx_00._4_4_;
  }
  JVar1.u._4_4_ = uStack_c;
  JVar1.u.int32 = local_10;
  JVar1.tag = (int64_t)local_8.ptr;
  return JVar1;
}

Assistant:

JSValue JS_NewCFunctionData(JSContext *ctx, JSCFunctionData *func,
                            int length, int magic, int data_len,
                            JSValueConst *data)
{
    JSCFunctionDataRecord *s;
    JSValue func_obj;
    int i;

    func_obj = JS_NewObjectProtoClass(ctx, ctx->function_proto,
                                      JS_CLASS_C_FUNCTION_DATA);
    if (JS_IsException(func_obj))
        return func_obj;
    s = js_malloc(ctx, sizeof(*s) + data_len * sizeof(JSValue));
    if (!s) {
        JS_FreeValue(ctx, func_obj);
        return JS_EXCEPTION;
    }
    s->func = func;
    s->length = length;
    s->data_len = data_len;
    s->magic = magic;
    for(i = 0; i < data_len; i++)
        s->data[i] = JS_DupValue(ctx, data[i]);
    JS_SetOpaque(func_obj, s);
    js_function_set_properties(ctx, func_obj,
                               JS_ATOM_empty_string, length);
    return func_obj;
}